

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Worker.cpp
# Opt level: O1

void __thiscall Worker::Run(Worker *this)

{
  int __fd;
  in_addr_t iVar1;
  ssize_t sVar2;
  undefined1 auStack_58 [8];
  sockaddr_in addr;
  undefined1 local_38 [16];
  
  auStack_58._0_2_ = 0;
  auStack_58[2] = '\0';
  auStack_58[3] = '\0';
  auStack_58[4] = '\0';
  auStack_58[5] = '\0';
  auStack_58[6] = '\0';
  auStack_58[7] = '\0';
  addr.sin_family = 0;
  addr.sin_port = 0;
  addr.sin_addr.s_addr = 0;
  __fd = socket(2,2,0);
  if (__fd < 0) {
    addr.sin_zero = (uchar  [8])local_38;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)addr.sin_zero,"Error: Creating socket.","");
    safe_cout(this,(string *)addr.sin_zero);
  }
  else {
    auStack_58._2_2_ = this->port_ << 8 | this->port_ >> 8;
    auStack_58._0_2_ = 2;
    iVar1 = inet_addr(this->dest_);
    auStack_58._4_4_ = iVar1;
    sVar2 = sendto(__fd,cflow_cap,700,0,(sockaddr *)auStack_58,0x10);
    if (-1 < sVar2) {
      do {
        LOCK();
        (this->requests_->super___atomic_base<unsigned_long>)._M_i =
             (this->requests_->super___atomic_base<unsigned_long>)._M_i + 1;
        UNLOCK();
        sVar2 = sendto(__fd,cflow_cap,700,0,(sockaddr *)auStack_58,0x10);
      } while (-1 < sVar2);
    }
    addr.sin_zero = (uchar  [8])local_38;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)addr.sin_zero,"Error: Sent failed.","");
    safe_cout(this,(string *)addr.sin_zero);
  }
  std::__cxx11::string::~string((string *)addr.sin_zero);
  exit(1);
}

Assistant:

void Worker::Run() {

    int sd;
    struct sockaddr_in addr{};

    if ((sd = socket(AF_INET, SOCK_DGRAM, 0)) < 0) {
        safe_cout("Error: Creating socket.");
        exit(EXIT_FAILURE);
    }

    addr.sin_family = AF_INET;
    addr.sin_port = htons ((short) (size_t) port_);
    addr.sin_addr.s_addr = inet_addr(dest_);

    while (true) {
        if (sendto(sd, &cflow_cap, sizeof(cflow_cap), 0,
                   (struct sockaddr *) &addr, sizeof(addr)) < 0) {
            safe_cout("Error: Sent failed.");
            exit(EXIT_FAILURE);
        }
        requests_->fetch_add(1);
    }

    close(sd);

}